

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rb_generator.cc
# Opt level: O2

void __thiscall t_rb_generator::~t_rb_generator(t_rb_generator *this)

{
  (this->super_t_oop_generator).super_t_generator._vptr_t_generator =
       (_func_int **)&PTR__t_rb_generator_00368850;
  std::__cxx11::string::~string((string *)&this->require_prefix_);
  std::__cxx11::string::~string((string *)&this->namespace_dir_);
  t_rb_ofstream::~t_rb_ofstream(&this->f_service_);
  t_rb_ofstream::~t_rb_ofstream(&this->f_consts_);
  t_rb_ofstream::~t_rb_ofstream(&this->f_types_);
  t_generator::~t_generator((t_generator *)this);
  return;
}

Assistant:

t_rb_generator(t_program* program,
                 const std::map<std::string, std::string>& parsed_options,
                 const std::string& option_string)
    : t_oop_generator(program) {
    (void)option_string;
    std::map<std::string, std::string>::const_iterator iter;

    require_rubygems_ = false;
    namespaced_ = false;
    for( iter = parsed_options.begin(); iter != parsed_options.end(); ++iter) {
      if( iter->first.compare("rubygems") == 0) {
        require_rubygems_ = true;
      } else if( iter->first.compare("namespaced") == 0) {
        namespaced_ = true;
      } else {
        throw "unknown option ruby:" + iter->first;
      }
    }

    out_dir_base_ = "gen-rb";
  }